

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
               _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *prefix,
               _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *postfix,ParseNode *pnodeParent)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  ParseNodeVar *pPVar5;
  ParseNodeForInOrForOf *pPVar6;
  ParseNodeWhile *pPVar7;
  ParseNodeBin *pPVar8;
  ParseNodeStrTemplate *pPVar9;
  ParseNodeTryFinally *pPVar10;
  ParseNodeTryCatch *pPVar11;
  ParseNodeIf *pPVar12;
  ParseNodeParamPattern *pPVar13;
  ParseNodeCase *pPVar14;
  ParseNodeBlock *pPVar15;
  ParseNode *pPVar16;
  ParseNodeWith *pPVar17;
  ParseNodeTri *pPVar18;
  undefined4 *puVar19;
  ParseNodeProg *pPVar20;
  ParseNodeTry *pPVar21;
  ParseNodeCall *pPVar22;
  ParseNodeSuperCall *pPVar23;
  ParseNodeFor *pPVar24;
  ParseNodeClass *pPVar25;
  ParseNodeSwitch *pPVar26;
  ParseNodeFnc *pPVar27;
  ParseNodeCatch *pPVar28;
  ParseNodeReturn *pPVar29;
  ParseNodeUni *pPVar30;
  SListNodeBase<Memory::ArenaAllocator> local_58;
  uint i;
  ArenaAllocator *local_48;
  ParseNode *local_40;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *local_38;
  
  if (pnode == (ParseNode *)0x0) {
    return;
  }
  local_40 = pnodeParent;
  ThreadContext::ProbeCurrentStackNoDispose(0x2400,byteCodeGenerator->scriptContext);
  (*prefix)(pnode,byteCodeGenerator);
  OVar1 = pnode->nop;
  pPVar16 = pnode;
  switch(OVar1) {
  case knopCall:
    pPVar22 = ParseNode::AsParseNodeCall(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar22->pnodeTarget,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar22 = ParseNode::AsParseNodeCall(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar22->pnodeArgs,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar22 = ParseNode::AsParseNodeCall(pnode);
    if ((pPVar22->field_0x24 & 8) == 0) break;
    pPVar23 = ParseNode::AsParseNodeSuperCall(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar23->pnodeThis,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar5 = (ParseNodeVar *)ParseNode::AsParseNodeSuperCall(pnode);
    goto LAB_00783d18;
  case knopDot:
  case knopAsg:
  case knopInstOf:
  case knopIn:
  case knopEqv:
  case knopNEqv:
  case knopLogOr:
  case knopLogAnd:
  case knopCoalesce:
  case knopLsh:
  case knopRsh:
  case knopRs2:
  case knopIndex:
  case knopAsgAdd:
  case knopAsgSub:
  case knopAsgMul:
  case knopAsgDiv:
  case knopAsgExpo:
  case knopAsgMod:
  case knopAsgAnd:
  case knopAsgXor:
  case knopAsgOr:
  case knopAsgLsh:
  case knopAsgRsh:
  case knopAsgRs2:
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
  case knopTemp:
  case knopModule:
  case knopEndCode:
  case knopDebugger:
  case knopObjectPattern:
  case knopObjectPatternMember:
switchD_00783700_caseD_30:
    uVar4 = ParseNode::Grfnop((uint)OVar1);
    if ((uVar4 & 4) != 0) goto switchD_00783700_caseD_6d;
    if ((uVar4 & 8) == 0) break;
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar8->pnode1,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar8->pnode2,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    bVar3 = ByteCodeGenerator::IsSuper(pPVar8->pnode1);
    if (!bVar3) break;
    pPVar9 = (ParseNodeStrTemplate *)ParseNode::AsParseNodeSuperReference(pnode);
    goto LAB_00783f89;
  case knopComma:
    local_38 = postfix;
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    postfix = local_38;
    pPVar16 = pPVar8->pnode1;
    if (pPVar16->nop == knopComma) {
      local_48 = byteCodeGenerator->alloc;
      i = 0;
      local_58.next = (Type)&stack0xffffffffffffffa8;
      do {
        pPVar8 = ParseNode::AsParseNodeBin(pPVar16);
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)&stack0xffffffffffffffa8
                   ,&pPVar8->pnode2);
        pPVar8 = ParseNode::AsParseNodeBin(pPVar16);
        postfix = local_38;
        pPVar16 = pPVar8->pnode1;
      } while (pPVar16->nop == knopComma);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar16,byteCodeGenerator,prefix,local_38,(ParseNode *)0x0);
      while ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_58.next !=
             (SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)&stack0xffffffffffffffa8) {
        pPVar16 = SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Pop
                            ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                             &stack0xffffffffffffffa8);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar16,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
      }
      SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::~SList
                ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)&stack0xffffffffffffffa8);
    }
    else {
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar16,byteCodeGenerator,prefix,local_38,(ParseNode *)0x0);
    }
    pPVar22 = (ParseNodeCall *)ParseNode::AsParseNodeBin(pnode);
    goto LAB_00783fe9;
  case knopNew:
    pPVar22 = ParseNode::AsParseNodeCall(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar22->pnodeTarget,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    bVar3 = IsCallOfConstants(pnode);
    if (bVar3) break;
    pPVar22 = ParseNode::AsParseNodeCall(pnode);
LAB_00783fe9:
    pPVar15 = (ParseNodeBlock *)pPVar22->pnodeArgs;
    goto LAB_00783fed;
  case knopQmark:
    pPVar18 = ParseNode::AsParseNodeTri(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar18->pnode1,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar18 = ParseNode::AsParseNodeTri(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar18->pnode2,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar9 = (ParseNodeStrTemplate *)ParseNode::AsParseNodeTri(pnode);
    goto LAB_00783f89;
  case knopList:
    VisitList<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pnode,byteCodeGenerator,prefix,postfix);
    break;
  case knopVarDecl:
  case knopConstDecl:
  case knopLetDecl:
    pPVar5 = ParseNode::AsParseNodeVar(pnode);
    if (pPVar5->pnodeInit == (ParseNodePtr)0x0) break;
    pPVar5 = ParseNode::AsParseNodeVar(pnode);
LAB_00783d18:
    pPVar15 = (ParseNodeBlock *)pPVar5->pnodeInit;
    goto LAB_00783fed;
  case knopFncDecl:
  case knopBreak:
  case knopContinue:
    break;
  case knopClassDecl:
    pPVar25 = ParseNode::AsParseNodeClass(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (&pPVar25->pnodeDeclName->super_ParseNode,byteCodeGenerator,prefix,postfix,
               (ParseNode *)0x0);
    pPVar25 = ParseNode::AsParseNodeClass(pnode);
    BeginVisitBlock(pPVar25->pnodeBlock,byteCodeGenerator);
    pPVar25 = ParseNode::AsParseNodeClass(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar25->pnodeExtends,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar25 = ParseNode::AsParseNodeClass(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (&pPVar25->pnodeName->super_ParseNode,byteCodeGenerator,prefix,postfix,
               (ParseNode *)0x0);
    pPVar25 = ParseNode::AsParseNodeClass(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (&pPVar25->pnodeConstructor->super_ParseNode,byteCodeGenerator,prefix,postfix,
               (ParseNode *)0x0);
    pPVar25 = ParseNode::AsParseNodeClass(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar25->pnodeMembers,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar25 = ParseNode::AsParseNodeClass(pnode);
    pPVar15 = pPVar25->pnodeBlock;
    goto LAB_00783f10;
  case knopProg:
    pPVar27 = ParseNode::AsParseNodeFnc(pnode);
    if (pPVar27->pnodeBody == (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar19 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x152,"(pnode->AsParseNodeFnc()->pnodeBody)",
                         "pnode->AsParseNodeFnc()->pnodeBody");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar19 = 0;
    }
    local_58.next = (Type)((ulong)local_58.next._4_4_ << 0x20);
    pPVar27 = ParseNode::AsParseNodeFnc(pnode);
    VisitNestedScopes<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar27->pnodeScopes,pnode,byteCodeGenerator,prefix,postfix,
               (uint *)&stack0xffffffffffffffa8,false);
    pPVar27 = ParseNode::AsParseNodeFnc(pnode);
    BeginVisitBlock(pPVar27->pnodeScopes,byteCodeGenerator);
    pPVar27 = ParseNode::AsParseNodeFnc(pnode);
    pPVar16 = VisitBlock<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                        (pPVar27->pnodeBody,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar20 = ParseNode::AsParseNodeProg(pnode);
    pPVar20->pnodeLastValStmt = pPVar16;
    pPVar27 = ParseNode::AsParseNodeFnc(pnode);
    goto LAB_00783f0c;
  case knopFor:
    pPVar24 = ParseNode::AsParseNodeFor(pnode);
    BeginVisitBlock(pPVar24->pnodeBlock,byteCodeGenerator);
    pPVar24 = ParseNode::AsParseNodeFor(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar24->pnodeInit,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    ByteCodeGenerator::EnterLoop(byteCodeGenerator);
    pPVar24 = ParseNode::AsParseNodeFor(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar24->pnodeCond,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar24 = ParseNode::AsParseNodeFor(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar24->pnodeIncr,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar24 = ParseNode::AsParseNodeFor(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar24->pnodeBody,byteCodeGenerator,prefix,postfix,pnode);
    byteCodeGenerator->loopDepth = byteCodeGenerator->loopDepth - 1;
    pPVar24 = ParseNode::AsParseNodeFor(pnode);
    pPVar15 = pPVar24->pnodeBlock;
    goto LAB_00783f10;
  case knopIf:
    pPVar12 = ParseNode::AsParseNodeIf(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar12->pnodeCond,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar12 = ParseNode::AsParseNodeIf(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar12->pnodeTrue,byteCodeGenerator,prefix,postfix,pnode);
    pPVar12 = ParseNode::AsParseNodeIf(pnode);
    if (pPVar12->pnodeFalse == (ParseNodePtr)0x0) break;
    pPVar14 = (ParseNodeCase *)ParseNode::AsParseNodeIf(pnode);
    goto LAB_00783998;
  case knopWhile:
  case knopDoWhile:
    ByteCodeGenerator::EnterLoop(byteCodeGenerator);
    pPVar7 = ParseNode::AsParseNodeWhile(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar7->pnodeCond,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar7 = ParseNode::AsParseNodeWhile(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar7->pnodeBody,byteCodeGenerator,prefix,postfix,pnode);
    byteCodeGenerator->loopDepth = byteCodeGenerator->loopDepth - 1;
    break;
  case knopForIn:
  case knopForOf:
  case knopForAwaitOf:
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    BeginVisitBlock(pPVar6->pnodeBlock,byteCodeGenerator);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar6->pnodeLval,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar6->pnodeObj,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    ByteCodeGenerator::EnterLoop(byteCodeGenerator);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar6->pnodeBody,byteCodeGenerator,prefix,postfix,pnode);
    byteCodeGenerator->loopDepth = byteCodeGenerator->loopDepth - 1;
    pPVar27 = (ParseNodeFnc *)ParseNode::AsParseNodeForInOrForOf(pnode);
    goto LAB_00783f0c;
  case knopBlock:
    pPVar15 = ParseNode::AsParseNodeBlock(pnode);
    if (pPVar15->pnodeStmt == (ParseNodePtr)0x0) {
      pPVar15->pnodeLastValStmt = (ParseNodePtr)0x0;
      break;
    }
    BeginVisitBlock(pPVar15,byteCodeGenerator);
    pPVar16 = VisitBlock<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                        (pPVar15->pnodeStmt,byteCodeGenerator,prefix,postfix,pnode);
    pPVar15->pnodeLastValStmt = pPVar16;
    goto LAB_00783f10;
  case knopStrTemplate:
    pPVar9 = ParseNode::AsParseNodeStrTemplate(pnode);
    if ((pPVar9->field_0x2a & 1) == 0) {
      pPVar9 = ParseNode::AsParseNodeStrTemplate(pnode);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar9->pnodeStringLiterals,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    }
    pPVar9 = ParseNode::AsParseNodeStrTemplate(pnode);
    goto LAB_00783f89;
  case knopWith:
    pPVar17 = ParseNode::AsParseNodeWith(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar17->pnodeObj,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar17 = ParseNode::AsParseNodeWith(pnode);
    VisitWithStmt<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pnode,pPVar17->pnodeObj->location,byteCodeGenerator,prefix,postfix,pnode);
    break;
  case knopSwitch:
    pPVar26 = ParseNode::AsParseNodeSwitch(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar26->pnodeVal,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar26 = ParseNode::AsParseNodeSwitch(pnode);
    BeginVisitBlock(pPVar26->pnodeBlock,byteCodeGenerator);
    pPVar26 = ParseNode::AsParseNodeSwitch(pnode);
    for (pPVar16 = (ParseNode *)&pPVar26->pnodeCases; pPVar16 = *(ParseNode **)pPVar16,
        pPVar16 != (ParseNode *)0x0; pPVar16 = pPVar16 + 2) {
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar16,byteCodeGenerator,prefix,postfix,pnode);
    }
    pPVar26 = ParseNode::AsParseNodeSwitch(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar26->pnodeBlock,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar27 = (ParseNodeFnc *)ParseNode::AsParseNodeSwitch(pnode);
LAB_00783f0c:
    pPVar15 = pPVar27->pnodeScopes;
LAB_00783f10:
    EndVisitBlock(pPVar15,byteCodeGenerator);
    break;
  case knopCase:
    pPVar14 = ParseNode::AsParseNodeCase(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar14->pnodeExpr,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar14 = ParseNode::AsParseNodeCase(pnode);
LAB_00783998:
    pPVar15 = pPVar14->pnodeBody;
    goto LAB_00783ff9;
  case knopTryCatch:
    pPVar11 = ParseNode::AsParseNodeTryCatch(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar11->pnodeTry,byteCodeGenerator,prefix,postfix,pnode);
    pPVar11 = ParseNode::AsParseNodeTryCatch(pnode);
    goto LAB_007839c6;
  case knopCatch:
    BeginVisitCatch(pnode,byteCodeGenerator);
    pPVar28 = ParseNode::AsParseNodeCatch(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar28->pnodeParam,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeCatch(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pPVar28->pnodeBody,byteCodeGenerator,prefix,postfix,pnode);
    EndVisitCatch(pnode,byteCodeGenerator);
    break;
  case knopReturn:
    pPVar29 = ParseNode::AsParseNodeReturn(pnode);
    if (pPVar29->pnodeExpr == (ParseNodePtr)0x0) break;
    pPVar9 = (ParseNodeStrTemplate *)ParseNode::AsParseNodeReturn(pnode);
LAB_00783f89:
    pPVar15 = (ParseNodeBlock *)pPVar9->pnodeSubstitutionExpressions;
LAB_00783fed:
    pPVar16 = (ParseNode *)0x0;
LAB_00783ff9:
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar15,byteCodeGenerator,prefix,postfix,pPVar16);
    break;
  case knopTry:
    pPVar21 = ParseNode::AsParseNodeTry(pnode);
    goto LAB_00783b99;
  case knopThrow:
    goto switchD_00783700_caseD_6d;
  case knopFinally:
    pPVar21 = (ParseNodeTry *)ParseNode::AsParseNodeFinally(pnode);
LAB_00783b99:
    pPVar15 = (ParseNodeBlock *)pPVar21->pnodeBody;
    goto LAB_00783ff9;
  case knopTryFinally:
    pPVar10 = ParseNode::AsParseNodeTryFinally(pnode);
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              ((ParseNode *)pPVar10->pnodeTry,byteCodeGenerator,prefix,postfix,pnode);
    pPVar11 = (ParseNodeTryCatch *)ParseNode::AsParseNodeTryFinally(pnode);
LAB_007839c6:
    pPVar15 = (ParseNodeBlock *)pPVar11->pnodeCatch;
    goto LAB_00783ff9;
  case knopArrayPattern:
    if (byteCodeGenerator->inDestructuredPattern == false) {
      byteCodeGenerator->inDestructuredPattern = true;
      pPVar30 = ParseNode::AsParseNodeUni(pnode);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar30->pnode1,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
      byteCodeGenerator->inDestructuredPattern = false;
      break;
    }
    goto switchD_00783700_caseD_6d;
  case knopParamPattern:
    pPVar13 = ParseNode::AsParseNodeParamPattern(pnode);
    goto LAB_00783bb6;
  case knopExportDefault:
    pPVar13 = (ParseNodeParamPattern *)ParseNode::AsParseNodeExportDefault(pnode);
    goto LAB_00783bb6;
  default:
    if (OVar1 != knopTypeof) {
      if (OVar1 != knopArray) goto switchD_00783700_caseD_30;
      bVar3 = EmitAsConstantArray(pnode,byteCodeGenerator);
      if (bVar3) break;
    }
switchD_00783700_caseD_6d:
    pPVar13 = (ParseNodeParamPattern *)ParseNode::AsParseNodeUni(pnode);
LAB_00783bb6:
    pPVar15 = (ParseNodeBlock *)(pPVar13->super_ParseNodeUni).pnode1;
    goto LAB_00783fed;
  }
  if (local_40 != (ParseNode *)0x0) {
    PropagateFlags(pnode,local_40);
  }
  (*postfix)(pnode,byteCodeGenerator);
  return;
}

Assistant:

void Visit(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent)
{
    if (pnode == nullptr)
    {
        return;
    }

    ThreadContext::ProbeCurrentStackNoDispose(Js::Constants::MinStackByteCodeVisitor, byteCodeGenerator->GetScriptContext());

    prefix(pnode, byteCodeGenerator);
    switch (pnode->nop)
    {
    default:
    {
        uint flags = ParseNode::Grfnop(pnode->nop);
        if (flags&fnopUni)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        else if (flags&fnopBin)
        {
            Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);

            if (ByteCodeGenerator::IsSuper(pnode->AsParseNodeBin()->pnode1))
            {
                Visit(pnode->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, prefix, postfix);
            }
        }

        break;
    }

    case knopParamPattern:
        Visit(pnode->AsParseNodeParamPattern()->pnode1, byteCodeGenerator, prefix, postfix);
        break;

    case knopArrayPattern:
        if (!byteCodeGenerator->InDestructuredPattern())
        {
            byteCodeGenerator->SetInDestructuredPattern(true);
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
            byteCodeGenerator->SetInDestructuredPattern(false);
        }
        else
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopCall:
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);

        if (pnode->AsParseNodeCall()->isSuperCall)
        {
            Visit(pnode->AsParseNodeSuperCall()->pnodeThis, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeSuperCall()->pnodeNewTarget, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopNew:
    {
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        if (!IsCallOfConstants(pnode))
        {
            Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);
        }
        break;
    }

    case knopQmark:
        Visit(pnode->AsParseNodeTri()->pnode1, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode2, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode3, byteCodeGenerator, prefix, postfix);
        break;
    case knopList:
        VisitList(pnode, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopVarDecl    , "varDcl"    ,None    ,Var  ,fnopNone)
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
        if (pnode->AsParseNodeVar()->pnodeInit != nullptr)
            Visit(pnode->AsParseNodeVar()->pnodeInit, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopFncDecl    , "fncDcl"    ,None    ,Fnc  ,fnopLeaf)
    case knopFncDecl:
    {
        // Inner function declarations are visited before anything else in the scope.
        // (See VisitFunctionsInScope.)
        break;
    }
    case knopClassDecl:
    {
        Visit(pnode->AsParseNodeClass()->pnodeDeclName, byteCodeGenerator, prefix, postfix);
        // Now visit the class name and methods.
        BeginVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        // The extends clause is bound to the scope which contains the class name
        // (and the class name identifier is in a TDZ when the extends clause is evaluated).
        // See ES 2017 14.5.13 Runtime Semantics: ClassDefinitionEvaluation.
        Visit(pnode->AsParseNodeClass()->pnodeExtends, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeName, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeConstructor, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeMembers, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        break;
    }
    case knopStrTemplate:
    {
        // Visit the string node lists only if we do not have a tagged template.
        // We never need to visit the raw strings as they are not used in non-tagged templates and
        // tagged templates will register them as part of the callsite constant object.
        if (!pnode->AsParseNodeStrTemplate()->isTaggedTemplate)
        {
            Visit(pnode->AsParseNodeStrTemplate()->pnodeStringLiterals, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeStrTemplate()->pnodeSubstitutionExpressions, byteCodeGenerator, prefix, postfix);
        break;
    }
    case knopExportDefault:
        Visit(pnode->AsParseNodeExportDefault()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopProg       , "program"    ,None    ,Fnc  ,fnopNone)
    case knopProg:
    {
        // We expect that the global statements have been generated (meaning that the pnodeFncs
        // field is a real pointer, not an enumeration).
        Assert(pnode->AsParseNodeFnc()->pnodeBody);

        uint i = 0;
        VisitNestedScopes(pnode->AsParseNodeFnc()->pnodeScopes, pnode, byteCodeGenerator, prefix, postfix, &i);
        // Visiting global code: track the last value statement.
        BeginVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);
        pnode->AsParseNodeProg()->pnodeLastValStmt = VisitBlock(pnode->AsParseNodeFnc()->pnodeBody, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);

        break;
    }
    case knopFor:
        BeginVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeFor()->pnodeInit, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeFor()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeIncr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopIf         , "if"        ,None    ,If   ,fnopNone)
    case knopIf:
        Visit(pnode->AsParseNodeIf()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeIf()->pnodeTrue, byteCodeGenerator, prefix, postfix, pnode);
        if (pnode->AsParseNodeIf()->pnodeFalse != nullptr)
        {
            Visit(pnode->AsParseNodeIf()->pnodeFalse, byteCodeGenerator, prefix, postfix, pnode);
        }
        break;
    // PTNODE(knopWhile      , "while"        ,None    ,While,fnopBreak|fnopContinue)
    // PTNODE(knopDoWhile    , "do-while"    ,None    ,While,fnopBreak|fnopContinue)
    case knopDoWhile:
    case knopWhile:
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeWhile()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeWhile()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        break;
    // PTNODE(knopForIn      , "for in"    ,None    ,ForIn,fnopBreak|fnopContinue|fnopCleanup)
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
        BeginVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeLval, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeObj, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopReturn     , "return"    ,None    ,Uni  ,fnopNone)
    case knopReturn:
        if (pnode->AsParseNodeReturn()->pnodeExpr != nullptr)
            Visit(pnode->AsParseNodeReturn()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopBlock      , "{}"        ,None    ,Block,fnopNone)
    case knopBlock:
    {
        ParseNodeBlock * pnodeBlock = pnode->AsParseNodeBlock();
        if (pnodeBlock->pnodeStmt != nullptr)
        {
            BeginVisitBlock(pnodeBlock, byteCodeGenerator);
            pnodeBlock->pnodeLastValStmt = VisitBlock(pnodeBlock->pnodeStmt, byteCodeGenerator, prefix, postfix, pnode);
            EndVisitBlock(pnodeBlock, byteCodeGenerator);
        }
        else
        {
            pnodeBlock->pnodeLastValStmt = nullptr;
        }
        break;
    }
    // PTNODE(knopWith       , "with"        ,None    ,With ,fnopCleanup)
    case knopWith:
        Visit(pnode->AsParseNodeWith()->pnodeObj, byteCodeGenerator, prefix, postfix);
        VisitWithStmt(pnode, pnode->AsParseNodeWith()->pnodeObj->location, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopBreak      , "break"        ,None    ,Jump ,fnopNone)
    case knopBreak:
        // TODO: some representation of target
        break;
    // PTNODE(knopContinue   , "continue"    ,None    ,Jump ,fnopNone)
    case knopContinue:
        // TODO: some representation of target
        break;
    // PTNODE(knopSwitch     , "switch"    ,None    ,Switch,fnopBreak)
    case knopSwitch:
        Visit(pnode->AsParseNodeSwitch()->pnodeVal, byteCodeGenerator, prefix, postfix);
        BeginVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        for (ParseNodeCase *pnodeT = pnode->AsParseNodeSwitch()->pnodeCases; nullptr != pnodeT; pnodeT = pnodeT->pnodeNext)
        {
            Visit(pnodeT, byteCodeGenerator, prefix, postfix, pnode);
        }
        Visit(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopCase       , "case"        ,None    ,Case ,fnopNone)
    case knopCase:
        Visit(pnode->AsParseNodeCase()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCase()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopTypeof:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopTryCatchFinally,"try-catch-finally",None,TryCatchFinally,fnopCleanup)
    case knopTryFinally:
        Visit(pnode->AsParseNodeTryFinally()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryFinally()->pnodeFinally, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTryCatch      , "try-catch" ,None    ,TryCatch  ,fnopCleanup)
    case knopTryCatch:
        Visit(pnode->AsParseNodeTryCatch()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryCatch()->pnodeCatch, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTry        , "try"       ,None    ,Try  ,fnopCleanup)
    case knopTry:
        Visit(pnode->AsParseNodeTry()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopCatch:
        BeginVisitCatch(pnode, byteCodeGenerator);
        Visit(pnode->AsParseNodeCatch()->GetParam(), byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCatch()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        EndVisitCatch(pnode, byteCodeGenerator);
        break;
    case knopFinally:
        Visit(pnode->AsParseNodeFinally()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopThrow      , "throw"     ,None    ,Uni  ,fnopNone)
    case knopThrow:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    case knopArray:
    {
        bool arrayLitOpt = EmitAsConstantArray(pnode, byteCodeGenerator);
        if (!arrayLitOpt)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;
    }
    case knopComma:
    {
        ParseNode *pnode1 = pnode->AsParseNodeBin()->pnode1;
        if (pnode1->nop == knopComma)
        {
            // Spot-fix to avoid recursion on very large comma expressions.
            ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
            SList<ParseNode*> rhsStack(alloc);
            do
            {
                rhsStack.Push(pnode1->AsParseNodeBin()->pnode2);
                pnode1 = pnode1->AsParseNodeBin()->pnode1;
            }
            while (pnode1->nop == knopComma);

            Visit(pnode1, byteCodeGenerator, prefix, postfix);
            while (!rhsStack.Empty())
            {
                ParseNode *pnodeRhs = rhsStack.Pop();
                Visit(pnodeRhs, byteCodeGenerator, prefix, postfix);
            }
        }
        else
        {
            Visit(pnode1, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);
    }
        break;
    }
    if (pnodeParent)
    {
        PropagateFlags(pnode, pnodeParent);
    }
    postfix(pnode, byteCodeGenerator);
}